

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O0

bool __thiscall Neuron::tick(Neuron *this,float h)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  reference ppCVar5;
  float fVar6;
  double local_70;
  double local_48;
  ulong local_38;
  size_t i_2;
  ulong uStack_28;
  float activateThreshold;
  size_t i_1;
  size_t i;
  bool fired;
  float h_local;
  Neuron *this_local;
  
  bVar2 = 35.0 < this->m_prevMem;
  if (-40.0 < this->m_prevMem) {
    this->m_refractoryPeriod = true;
  }
  if (bVar2) {
    this->m_firing = true;
    this->m_curMem = -40.0;
    this->m_curAdd = this->m_prevAdd + 100.0;
    if ((this->m_expireSpeedFired != 0.0) || (NAN(this->m_expireSpeedFired))) {
      local_48 = exp((double)(-h / this->m_expireSpeedFired));
    }
    else {
      local_48 = 0.0;
    }
    this->m_synI = (float)((double)this->m_synI * local_48);
    for (i_1 = 0; sVar4 = std::vector<Connection,_std::allocator<Connection>_>::size
                                    (&this->m_connections), i_1 < sVar4; i_1 = i_1 + 1) {
      this_00 = std::vector<Connection,_std::allocator<Connection>_>::operator[]
                          (&this->m_connections,i_1);
      Connection::spike(this_00);
    }
    for (uStack_28 = 0;
        sVar4 = std::vector<Connection_*,_std::allocator<Connection_*>_>::size
                          (&this->m_incomingSpikes), uStack_28 < sVar4; uStack_28 = uStack_28 + 1) {
      ppCVar5 = std::vector<Connection_*,_std::allocator<Connection_*>_>::operator[]
                          (&this->m_incomingSpikes,uStack_28);
      Connection::teach(*ppCVar5,1.0);
    }
    std::vector<Connection_*,_std::allocator<Connection_*>_>::clear(&this->m_incomingSpikes);
  }
  else {
    fVar1 = this->m_prevMem;
    fVar6 = prevMem(this);
    this->m_curMem = h * fVar6 + fVar1;
    fVar1 = this->m_prevAdd;
    fVar6 = prevAdd(this);
    this->m_curAdd = h * fVar6 + fVar1;
    if ((this->m_expireSpeedNotFired != 0.0) || (NAN(this->m_expireSpeedNotFired))) {
      local_70 = exp((double)(-h / this->m_expireSpeedNotFired));
    }
    else {
      local_70 = 1.0;
    }
    this->m_synI = (float)((double)this->m_synI * local_70);
    if ((-57.0 < this->m_prevMem) && (this->m_curMem <= -57.0)) {
      for (local_38 = 0;
          sVar4 = std::vector<Connection_*,_std::allocator<Connection_*>_>::size
                            (&this->m_incomingSpikes), local_38 < sVar4; local_38 = local_38 + 1) {
        ppCVar5 = std::vector<Connection_*,_std::allocator<Connection_*>_>::operator[]
                            (&this->m_incomingSpikes,local_38);
        Connection::teach(*ppCVar5,-1.0);
      }
      std::vector<Connection_*,_std::allocator<Connection_*>_>::clear(&this->m_incomingSpikes);
    }
    if (this->m_prevMem <= -60.0) {
      this->m_firing = false;
    }
    if (((this->m_firing & 1U) == 0) && (-60.0 < this->m_prevMem)) {
      this->m_refractoryPeriod = false;
    }
  }
  this->m_prevMem = this->m_curMem;
  this->m_prevAdd = this->m_curAdd;
  if (((this->m_refractoryPeriod & 1U) == 0) && (bVar3 = watchForSpiked(this), bVar3)) {
    spike(this);
  }
  return bVar2;
}

Assistant:

bool Neuron::tick(float h)
{
    bool fired = m_prevMem > kSpikeThreshold;
    if (m_prevMem > kMembraneAfterSpike)
        m_refractoryPeriod = true;

    if (fired) {
        m_firing = true;
        m_curMem = kMembraneAfterSpike;
        m_curAdd = m_prevAdd + 100.0f;
        m_synI *= m_expireSpeedFired ? exp(-h / m_expireSpeedFired) : 0;

        for (size_t i = 0; i < m_connections.size(); ++i)
            m_connections[i].spike();

        for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
            m_incomingSpikes[i]->teach(1);

        m_incomingSpikes.clear();
    } else {
        m_curMem = m_prevMem + h * prevMem();
        m_curAdd = m_prevAdd + h * prevAdd();
        m_synI *= m_expireSpeedNotFired ? exp(-h / m_expireSpeedNotFired) : 1;

        // All prev spikes could not activate current neuron.
        // TODO: val should be param?
        const float activateThreshold = -57.0f;
        if (m_prevMem > activateThreshold && m_curMem <= activateThreshold) {
            for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
                m_incomingSpikes[i]->teach(-1);

            m_incomingSpikes.clear();
        }

        if (m_prevMem <= kDefaultMembrane)
            m_firing = false;

        if (!m_firing && m_prevMem > kDefaultMembrane)
            m_refractoryPeriod = false;
    }

    m_prevMem = m_curMem;
    m_prevAdd = m_curAdd;

    if (!m_refractoryPeriod && watchForSpiked())
        spike();

    return fired;
}